

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O3

void __thiscall
kratos::DependencyVisitor::CombinationBlockVisitor::~CombinationBlockVisitor
          (CombinationBlockVisitor *this)

{
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002ac2d8;
  std::
  _Hashtable<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->linked_vars_)._M_h);
  std::
  _Hashtable<const_kratos::Var_*,_const_kratos::Var_*,_std::allocator<const_kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->vars_)._M_h);
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002aab58;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->super_IRVisitor).visited_._M_h);
  operator_delete(this,0xb8);
  return;
}

Assistant:

void visit(IfStmt *stmt) override {
            auto predicate = stmt->predicate();
            auto const &[dep, linked] = DependencyVisitor::get_dep(predicate.get());
            for (auto const &var : dep) vars_.emplace(var);
            for (auto const &[var, entry] : linked) {
                linked_vars_[var].insert(entry.begin(), entry.end());
            }
        }